

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshvolume.cpp
# Opt level: O1

float computeMeshVolume(float *vertices,uint tcount,uint *indices)

{
  float fVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [64];
  
  auVar6 = ZEXT816(0) << 0x40;
  auVar7 = ZEXT1664(auVar6);
  if (tcount != 0) {
    do {
      uVar2 = (ulong)(*indices * 3);
      uVar3 = (ulong)(indices[1] * 3);
      uVar4 = (ulong)(indices[2] * 3);
      auVar6 = vfmadd231ss_fma(ZEXT416((uint)(vertices[uVar4 + 1] * vertices[uVar3] *
                                             vertices[uVar2 + 2])),
                               ZEXT416((uint)vertices[uVar4 + 2]),
                               ZEXT416((uint)(vertices[uVar2] * vertices[uVar3 + 1])));
      auVar6 = vfmadd213ss_fma(ZEXT416((uint)(vertices[uVar4] * vertices[uVar2 + 1])),
                               ZEXT416((uint)vertices[uVar3 + 2]),auVar6);
      auVar6 = vfnmadd213ss_fma(ZEXT416((uint)(vertices[uVar4 + 1] * vertices[uVar2])),
                                ZEXT416((uint)vertices[uVar3 + 2]),auVar6);
      auVar6 = vfnmadd213ss_fma(ZEXT416((uint)(vertices[uVar2 + 1] * vertices[uVar3])),
                                ZEXT416((uint)vertices[uVar4 + 2]),auVar6);
      auVar6 = vfnmadd213ss_fma(ZEXT416((uint)(vertices[uVar3 + 1] * vertices[uVar4])),
                                ZEXT416((uint)vertices[uVar2 + 2]),auVar6);
      fVar1 = auVar7._0_4_ + auVar6._0_4_;
      auVar7 = ZEXT464((uint)fVar1);
      indices = indices + 3;
      tcount = tcount - 1;
    } while (tcount != 0);
    auVar6 = ZEXT416((uint)(fVar1 * 0.16666667));
  }
  auVar5._8_4_ = 0x80000000;
  auVar5._0_8_ = 0x8000000080000000;
  auVar5._12_4_ = 0x80000000;
  auVar5 = vxorps_avx512vl(auVar6,auVar5);
  auVar6 = vmaxss_avx(auVar5,auVar6);
  return auVar6._0_4_;
}

Assistant:

float computeMeshVolume(const float *vertices,unsigned int tcount,const unsigned int *indices)
{
	float volume = 0;

	for (unsigned int i=0; i<tcount; i++,indices+=3)
	{

		const float *p1 = &vertices[ indices[0]*3 ];
		const float *p2 = &vertices[ indices[1]*3 ];
		const float *p3 = &vertices[ indices[2]*3 ];

		volume+=det(p1,p2,p3); // compute the volume of the tetrahedron relative to the origin.
	}

	volume*=(1.0f/6.0f);
	if ( volume < 0 ) 
		volume*=-1;
	return volume;
}